

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O1

void __thiscall MT32Emu::TVF::nextPhase(TVF *this)

{
  uint uVar1;
  bool bVar2;
  Bit8u target;
  Tables *pTVar3;
  Poly *this_00;
  int iVar4;
  byte increment;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  LA32Ramp *this_01;
  uint uVar5;
  
  pTVar3 = Tables::getInstance();
  uVar5 = this->phase;
  uVar1 = uVar5 + 1;
  if (uVar5 - 4 < 2) {
    this_00 = Partial::getPoly(this->partial);
    bVar2 = Poly::canSustain(this_00);
    if (!bVar2) {
      this->phase = uVar1;
      startDecay(this);
      return;
    }
    this_01 = this->cutoffModifierRamp;
    target = (Bit8u)((uint)(this->partialParam->tvf).envLevel[3] * this->levelMult >> 8);
    this->target = target;
    this->phase = uVar1;
  }
  else {
    if (uVar5 != 6) {
      uVar6 = (uint)(this->partialParam->tvf).envLevel[(int)uVar5] * this->levelMult;
      uVar8 = uVar6 >> 8;
      uVar5 = (uint)(this->partialParam->tvf).envTime[(int)uVar5];
      iVar4 = uVar5 - this->keyTimeSubtraction;
      if (iVar4 == 0 || (int)uVar5 < this->keyTimeSubtraction) {
        increment = (this->target <= uVar8) << 7 | 0x7f;
      }
      else {
        uVar5 = uVar8 - 1;
        if (uVar6 < 0x100) {
          uVar5 = 1;
        }
        uVar7 = uVar8 - this->target;
        if (uVar7 == 0) {
          uVar7 = (uVar6 < 0x100) - 1 | 1;
          uVar8 = uVar5;
        }
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        iVar4 = (uint)pTVar3->envLogarithmicTime[uVar5] - iVar4;
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        increment = (byte)(uVar7 >> 0x18) & 0x80 | (byte)iVar4;
      }
      target = (Bit8u)uVar8;
      this->target = target;
      this->phase = uVar1;
      this_01 = this->cutoffModifierRamp;
      goto LAB_00184b42;
    }
    this->target = '\0';
    this->phase = 7;
    this_01 = this->cutoffModifierRamp;
    target = '\0';
  }
  increment = 0;
LAB_00184b42:
  LA32Ramp::startRamp(this_01,target,increment);
  return;
}

Assistant:

void TVF::nextPhase() {
	const Tables *tables = &Tables::getInstance();
	int newPhase = phase + 1;

	switch (newPhase) {
	case PHASE_DONE:
		startRamp(0, 0, newPhase);
		return;
	case PHASE_SUSTAIN:
	case PHASE_RELEASE:
		// FIXME: Afaict newPhase should never be PHASE_RELEASE here. And if it were, this is an odd way to handle it.
		if (!partial->getPoly()->canSustain()) {
			phase = newPhase; // FIXME: Correct?
			startDecay(); // FIXME: This should actually start decay even if phase is already 6. Does that matter?
			return;
		}
		startRamp((levelMult * partialParam->tvf.envLevel[3]) >> 8, 0, newPhase);
		return;
	default:
		break;
	}

	int envPointIndex = phase;
	int envTimeSetting = partialParam->tvf.envTime[envPointIndex] - keyTimeSubtraction;

	int newTarget = (levelMult * partialParam->tvf.envLevel[envPointIndex]) >> 8;
	int newIncrement;
	if (envTimeSetting > 0) {
		int targetDelta = newTarget - target;
		if (targetDelta == 0) {
			if (newTarget == 0) {
				targetDelta = 1;
				newTarget = 1;
			} else {
				targetDelta = -1;
				newTarget--;
			}
		}
		newIncrement = tables->envLogarithmicTime[targetDelta < 0 ? -targetDelta : targetDelta] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
		if (targetDelta < 0) {
			newIncrement |= 0x80;
		}
	} else {
		newIncrement = newTarget >= target ? (0x80 | 127) : 127;
	}
	startRamp(newTarget, newIncrement, newPhase);
}